

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block.c
# Opt level: O3

int cdef_find_dir_c(uint16_t *img,int stride,int32_t *var,int coeff_shift)

{
  int *piVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  undefined1 *puVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int *piVar12;
  long lVar13;
  int j;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  undefined1 auVar24 [16];
  int iVar25;
  int partial [8] [15];
  undefined1 auStack_308 [184];
  undefined8 uStack_250;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  int *local_220;
  int local_218 [7];
  int local_1fc;
  int local_1e0 [16];
  int aiStack_1a0 [30];
  int aiStack_128 [7];
  int local_10c [7];
  int local_f0 [4];
  int local_e0 [12];
  int aiStack_b0 [15];
  int local_74 [17];
  
  puVar4 = local_248;
  local_238 = (undefined1  [16])0x0;
  local_248 = (undefined1  [16])0x0;
  piVar8 = local_218;
  lVar15 = 0;
  uStack_250 = 0x38bad8;
  local_220 = var;
  memset(piVar8,0,0x1e0);
  piVar6 = local_10c;
  do {
    uVar9 = lVar15 * 2 & 0xfffffffffffffffc;
    uVar14 = 0;
    piVar12 = piVar6;
    do {
      iVar5 = (img[uVar14] >> ((byte)coeff_shift & 0x1f)) - 0x80;
      piVar8[uVar14] = piVar8[uVar14] + iVar5;
      uVar3 = (uint)(uVar14 >> 1) & 0x7fffffff;
      aiStack_1a0[(ulong)(uVar3 + (int)lVar15) - 0xf] =
           aiStack_1a0[(ulong)(uVar3 + (int)lVar15) - 0xf] + iVar5;
      aiStack_1a0[lVar15] = aiStack_1a0[lVar15] + iVar5;
      aiStack_128[(ulong)(((int)lVar15 + 3) - uVar3) - 0xf] =
           aiStack_128[(ulong)(((int)lVar15 + 3) - uVar3) - 0xf] + iVar5;
      *piVar12 = *piVar12 + iVar5;
      piVar1 = (int *)((long)aiStack_b0 + (uVar14 * 4 - uVar9) + -0x30);
      *piVar1 = *piVar1 + iVar5;
      aiStack_b0[uVar14] = aiStack_b0[uVar14] + iVar5;
      piVar1 = (int *)((long)local_74 + uVar14 * 4 + uVar9);
      *piVar1 = *piVar1 + iVar5;
      uVar14 = uVar14 + 1;
      piVar12 = piVar12 + -1;
    } while (uVar14 != 8);
    lVar15 = lVar15 + 1;
    img = img + stride;
    piVar6 = piVar6 + 1;
    piVar8 = piVar8 + 1;
  } while (lVar15 != 8);
  iVar20 = 0;
  iVar21 = 0;
  iVar22 = 0;
  iVar23 = 0;
  lVar15 = 0x5a;
  iVar5 = 0;
  iVar17 = 0;
  iVar18 = 0;
  iVar19 = 0;
  do {
    auVar24 = *(undefined1 (*) [16])(auStack_308 + lVar15 * 4);
    auVar2 = *(undefined1 (*) [16])(local_218 + lVar15);
    iVar20 = iVar20 + auVar24._0_4_ * auVar24._0_4_;
    iVar21 = iVar21 + auVar24._4_4_ * auVar24._4_4_;
    iVar22 = iVar22 + (int)((auVar24._8_8_ & 0xffffffff) * (auVar24._8_8_ & 0xffffffff));
    iVar23 = iVar23 + auVar24._12_4_ * auVar24._12_4_;
    iVar25 = auVar2._4_4_;
    auVar24._4_4_ = iVar25;
    auVar24._0_4_ = iVar25;
    auVar24._8_4_ = auVar2._12_4_;
    auVar24._12_4_ = auVar2._12_4_;
    iVar5 = iVar5 + auVar2._0_4_ * auVar2._0_4_;
    iVar17 = iVar17 + iVar25 * iVar25;
    iVar18 = iVar18 + (int)((auVar2._8_8_ & 0xffffffff) * (auVar2._8_8_ & 0xffffffff));
    iVar19 = iVar19 + (int)((auVar24._8_8_ & 0xffffffff) * (auVar24._8_8_ & 0xffffffff));
    lVar15 = lVar15 + 4;
  } while (lVar15 != 0x62);
  local_248._8_4_ = (iVar23 + iVar21 + iVar22 + iVar20) * 0x69;
  local_238._8_4_ = (iVar19 + iVar17 + iVar18 + iVar5) * 0x69;
  lVar15 = 0;
  piVar8 = local_1e0;
  iVar17 = 0;
  iVar5 = 0;
  do {
    piVar6 = local_218 + lVar15;
    piVar12 = aiStack_128 + lVar15;
    lVar7 = lVar15 + 1;
    lVar15 = lVar15 + 1;
    iVar17 = iVar17 + (*piVar8 * *piVar8 + *piVar6 * *piVar6) * cdef_find_dir_c::div_table[lVar7];
    iVar5 = iVar5 + (piVar8[0x3c] * piVar8[0x3c] + *piVar12 * *piVar12) *
                    cdef_find_dir_c::div_table[lVar7];
    piVar8 = piVar8 + -1;
  } while (lVar15 != 7);
  local_248._0_4_ = local_1fc * local_1fc * 0x69 + iVar17;
  local_238._0_4_ = local_10c[0] * local_10c[0] * 0x69 + iVar5;
  lVar15 = 100;
  lVar7 = 0x3c;
  uVar9 = 1;
  do {
    puVar4 = puVar4 + 0x78;
    iVar5 = *(int *)(local_248 + uVar9 * 4);
    lVar10 = 0;
    do {
      iVar5 = iVar5 + *(int *)(puVar4 + lVar10 * 4) * *(int *)(puVar4 + lVar10 * 4);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 5);
    iVar5 = iVar5 * 0x69;
    lVar13 = 0;
    lVar10 = lVar7;
    lVar11 = lVar15;
    do {
      iVar5 = iVar5 + (*(int *)((long)local_218 + lVar11) * *(int *)((long)local_218 + lVar11) +
                      *(int *)((long)local_218 + lVar10) * *(int *)((long)local_218 + lVar10)) *
                      cdef_find_dir_c::div_table[lVar13 * 2 + 2];
      lVar13 = lVar13 + 1;
      lVar11 = lVar11 + -4;
      lVar10 = lVar10 + 4;
    } while (lVar13 != 3);
    *(int *)(local_248 + uVar9 * 4) = iVar5;
    lVar15 = lVar15 + 0x78;
    lVar7 = lVar7 + 0x78;
    bVar16 = uVar9 < 6;
    uVar9 = uVar9 + 2;
  } while (bVar16);
  uVar14 = 0;
  uVar9 = 0;
  iVar5 = 0;
  do {
    if (iVar5 < *(int *)(local_248 + uVar14 * 4)) {
      uVar9 = uVar14 & 0xffffffff;
      iVar5 = *(int *)(local_248 + uVar14 * 4);
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != 8);
  *local_220 = iVar5 - *(int *)(local_248 + (ulong)((uint)uVar9 & 7 ^ 4) * 4) >> 10;
  return (uint)uVar9;
}

Assistant:

int cdef_find_dir_c(const uint16_t *img, int stride, int32_t *var,
                    int coeff_shift) {
  int i;
  int32_t cost[8] = { 0 };
  int partial[8][15] = { { 0 } };
  int32_t best_cost = 0;
  int best_dir = 0;
  /* Instead of dividing by n between 2 and 8, we multiply by 3*5*7*8/n.
     The output is then 840 times larger, but we don't care for finding
     the max. */
  static const int div_table[] = { 0, 840, 420, 280, 210, 168, 140, 120, 105 };
  for (i = 0; i < 8; i++) {
    int j;
    for (j = 0; j < 8; j++) {
      int x;
      /* We subtract 128 here to reduce the maximum range of the squared
         partial sums. */
      x = (img[i * stride + j] >> coeff_shift) - 128;
      partial[0][i + j] += x;
      partial[1][i + j / 2] += x;
      partial[2][i] += x;
      partial[3][3 + i - j / 2] += x;
      partial[4][7 + i - j] += x;
      partial[5][3 - i / 2 + j] += x;
      partial[6][j] += x;
      partial[7][i / 2 + j] += x;
    }
  }
  for (i = 0; i < 8; i++) {
    cost[2] += partial[2][i] * partial[2][i];
    cost[6] += partial[6][i] * partial[6][i];
  }
  cost[2] *= div_table[8];
  cost[6] *= div_table[8];
  for (i = 0; i < 7; i++) {
    cost[0] += (partial[0][i] * partial[0][i] +
                partial[0][14 - i] * partial[0][14 - i]) *
               div_table[i + 1];
    cost[4] += (partial[4][i] * partial[4][i] +
                partial[4][14 - i] * partial[4][14 - i]) *
               div_table[i + 1];
  }
  cost[0] += partial[0][7] * partial[0][7] * div_table[8];
  cost[4] += partial[4][7] * partial[4][7] * div_table[8];
  for (i = 1; i < 8; i += 2) {
    int j;
    for (j = 0; j < 4 + 1; j++) {
      cost[i] += partial[i][3 + j] * partial[i][3 + j];
    }
    cost[i] *= div_table[8];
    for (j = 0; j < 4 - 1; j++) {
      cost[i] += (partial[i][j] * partial[i][j] +
                  partial[i][10 - j] * partial[i][10 - j]) *
                 div_table[2 * j + 2];
    }
  }
  for (i = 0; i < 8; i++) {
    if (cost[i] > best_cost) {
      best_cost = cost[i];
      best_dir = i;
    }
  }
  /* Difference between the optimal variance and the variance along the
     orthogonal direction. Again, the sum(x^2) terms cancel out. */
  *var = best_cost - cost[(best_dir + 4) & 7];
  /* We'd normally divide by 840, but dividing by 1024 is close enough
     for what we're going to do with this. */
  *var >>= 10;
  return best_dir;
}